

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertLights(FBXConverter *this,Model *model,string *orig_name)

{
  bool bVar1;
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  *this_00;
  reference ppNVar2;
  Light *local_68;
  Light *light;
  NodeAttribute *attr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  *__range2;
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  *node_attrs;
  string *orig_name_local;
  Model *model_local;
  FBXConverter *this_local;
  
  this_00 = Model::GetAttributes(model);
  __end2 = std::
           vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
           ::begin(this_00);
  attr = (NodeAttribute *)
         std::
         vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::NodeAttribute_*const_*,_std::vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>_>
                                *)&attr);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::NodeAttribute_*const_*,_std::vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>_>
              ::operator*(&__end2);
    if (*ppNVar2 == (NodeAttribute *)0x0) {
      local_68 = (Light *)0x0;
    }
    else {
      local_68 = (Light *)__dynamic_cast(*ppNVar2,&NodeAttribute::typeinfo,&FBX::Light::typeinfo,0);
    }
    if (local_68 != (Light *)0x0) {
      ConvertLight(this,local_68,orig_name);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::NodeAttribute_*const_*,_std::vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void FBXConverter::ConvertLights(const Model& model, const std::string &orig_name) {
            const std::vector<const NodeAttribute*>& node_attrs = model.GetAttributes();
            for (const NodeAttribute* attr : node_attrs) {
                const Light* const light = dynamic_cast<const Light*>(attr);
                if (light) {
                    ConvertLight(*light, orig_name);
                }
            }
        }